

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O2

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> * __thiscall
Bob::ExtractPermutationShare
          (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
           *__return_storage_ptr__,Bob *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *V,int rows,int cols)

{
  ulong uVar1;
  int iVar2;
  pointer ppVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  value_type local_48;
  
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (__return_storage_ptr__,(long)rows,(allocator_type *)&local_48);
  uVar1 = 0;
  iVar2 = 0;
  if (0 < cols) {
    iVar2 = cols;
  }
  uVar5 = (ulong)(uint)rows;
  if (rows < 1) {
    uVar5 = uVar1;
  }
  local_48.first = 0;
  local_48.second = 0;
  for (; uVar1 != uVar5; uVar1 = uVar1 + 1) {
    ppVar3 = (__return_storage_ptr__->
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
             _M_impl.super__Vector_impl_data._M_start + uVar1;
    iVar4 = iVar2;
    while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
      ppVar3->first =
           *(long *)(*(long *)&(V->
                               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar1].
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data + -8 + (long)cols * 8);
      ppVar3->second = 0;
    }
  }
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
            (__return_storage_ptr__,&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<long,long>>Bob::ExtractPermutationShare(std::vector<std::vector<long>>V, int rows, int cols)
{
    std::vector<std::pair<long,long>> Perm(rows);
    std::pair<long, long> last(0,0);
    for(int i = 0; i < rows; i++)
    {
        for(int j = 0; j < cols; j++)
        {
            Perm[i].first = V[i][cols-1];   //old address
            Perm[i].second = 0;             //permuted address   
        }
    }
    Perm.push_back(last);
    return Perm;
}